

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::
base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
::value_check(base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *this,value_type *x)

{
  reference x_00;
  iterator iVar1;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>_>
  local_88;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_68;
  int local_60;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_58;
  int local_50;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *local_48;
  int local_40;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
  local_38;
  long *local_28;
  key_type *key;
  value_type *pvStack_18;
  type key_of_value;
  value_type *x_local;
  base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  *this_local;
  
  pvStack_18 = x;
  local_28 = KeyOfValue<long,_long>::type::operator()((type *)((long)&key + 7),x);
  iVar1 = find(this,local_28);
  local_48 = iVar1.node;
  local_40 = iVar1.position;
  local_38.node = local_48;
  local_38.position = local_40;
  x_00 = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>,_long_&,_long_*>
         ::operator*(&local_38);
  (anonymous_namespace)::CheckPairEquals<long,long>(x_00,pvStack_18);
  iVar1 = lower_bound(this,local_28);
  local_58 = iVar1.node;
  local_50 = iVar1.position;
  iVar1 = upper_bound(this,local_28);
  local_68 = iVar1.node;
  local_60 = iVar1.position;
  equal_range(&local_88,this,local_28);
  contains(this,local_28);
  count(this,local_28);
  return;
}

Assistant:

void value_check(const value_type &x) {
        typename KeyOfValue<typename TreeType::key_type,
                            typename TreeType::value_type>::type key_of_value;
        const key_type &key = key_of_value(x);
        CheckPairEquals(*find(key), x);
        lower_bound(key);
        upper_bound(key);
        equal_range(key);
        contains(key);
        count(key);
    }